

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetEnumValueName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,string_view enum_name,
          string_view enum_value_name)

{
  char *pcVar1;
  string_view input;
  string result;
  string stripped;
  string local_b0;
  string local_90;
  AlphaNum local_70;
  string_view local_40 [3];
  
  pcVar1 = enum_name._M_str;
  TryRemovePrefix_abi_cxx11_(&local_90,this,enum_name,enum_value_name);
  input._M_str = pcVar1;
  input._M_len = (size_t)local_90._M_dataplus._M_p;
  ShoutyToPascalCase_abi_cxx11_(&local_b0,(csharp *)local_90._M_string_length,input);
  if ((byte)(*local_b0._M_dataplus._M_p - 0x30U) < 10) {
    local_40[0] = absl::lts_20250127::NullSafeStringView("_");
    local_70.piece_._M_len = local_b0._M_string_length;
    local_70.piece_._M_str = local_b0._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_40,&local_70,
               (AlphaNum *)local_b0._M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b0.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b0._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,local_b0.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_b0._M_string_length;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string GetEnumValueName(absl::string_view enum_name,
                             absl::string_view enum_value_name) {
  std::string stripped = TryRemovePrefix(enum_name, enum_value_name);
  std::string result = ShoutyToPascalCase(stripped);
  // Just in case we have an enum name of FOO and a value of FOO_2... make sure
  // the returned string is a valid identifier.
  if (absl::ascii_isdigit(result[0])) {
    return absl::StrCat("_", result);
  }
  return result;
}